

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLap_3D_K.H
# Opt level: O1

void amrex::mlndlap_bc_doit<double>
               (Box *vbx,Array4<double> *a,Box *domain,GpuArray<bool,_3U> *bflo,
               GpuArray<bool,_3U> *bfhi)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  int *piVar4;
  double dVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  double *pdVar17;
  int iVar18;
  undefined8 uVar19;
  undefined1 uVar20;
  int idim;
  int iVar21;
  int iVar22;
  int iVar23;
  long lVar24;
  double *pdVar25;
  uint uVar26;
  int iVar27;
  int iVar28;
  long lVar29;
  int iVar30;
  int iVar31;
  uint uVar32;
  int iVar33;
  long lVar34;
  int iVar35;
  long lVar36;
  int iVar37;
  uint uVar38;
  int iVar39;
  long lVar40;
  long lVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  int iVar45;
  int iVar46;
  long lVar47;
  Long LVar48;
  long lVar49;
  int iVar50;
  long lVar51;
  long lVar52;
  long lVar53;
  long lVar54;
  char cVar55;
  int iVar56;
  long lVar57;
  long lVar58;
  bool bVar59;
  bool bVar60;
  bool bVar61;
  bool bVar62;
  bool bVar63;
  undefined4 uVar64;
  undefined4 uVar65;
  Box gdomain;
  undefined8 local_c8;
  int local_c0;
  int local_bc [2];
  undefined8 uStack_b4;
  
  uVar19 = *(undefined8 *)((domain->smallend).vect + 2);
  local_bc[1] = (int)((ulong)*(undefined8 *)(domain->bigend).vect >> 0x20);
  uStack_b4 = *(undefined8 *)((domain->bigend).vect + 2);
  local_c8 = *(undefined8 *)(domain->smallend).vect;
  local_c0 = (int)uVar19;
  local_bc[0] = (int)((ulong)uVar19 >> 0x20);
  lVar24 = 0;
  do {
    if (bflo->arr[lVar24] == false) {
      piVar4 = (int *)((long)&local_c8 + lVar24 * 4);
      *piVar4 = *piVar4 + -1;
    }
    if (bfhi->arr[lVar24] == false) {
      local_bc[lVar24] = local_bc[lVar24] + 1;
    }
    lVar24 = lVar24 + 1;
  } while (lVar24 != 3);
  iVar30 = (vbx->smallend).vect[0];
  if (((((iVar30 <= (int)local_c8) || ((vbx->smallend).vect[1] <= local_c8._4_4_)) ||
       ((vbx->smallend).vect[2] <= local_c0)) ||
      ((local_bc[0] <= (vbx->bigend).vect[0] || (local_bc[1] <= (vbx->bigend).vect[1])))) ||
     ((int)uStack_b4 <= (vbx->bigend).vect[2])) {
    uVar38 = (domain->btype).itype;
    iVar42 = (vbx->smallend).vect[2] + -1;
    iVar37 = (vbx->bigend).vect[2] + 1;
    if (iVar42 <= iVar37) {
      iVar21 = (vbx->smallend).vect[1] + -1;
      iVar30 = iVar30 + -1;
      iVar11 = (vbx->bigend).vect[0];
      iVar22 = (vbx->bigend).vect[1] + 1;
      lVar57 = (long)(domain->smallend).vect[0] + -1;
      iVar23 = (domain->smallend).vect[1] + -1;
      iVar33 = (domain->smallend).vect[2] + -1;
      lVar24 = (long)(domain->bigend).vect[0] + 1;
      iVar44 = (domain->bigend).vect[1] + 1;
      iVar35 = (domain->bigend).vect[2] + 1;
      uVar26 = 2 - (uVar38 == 0);
      uVar38 = ~(uint)(uVar38 != 0);
      do {
        if (iVar21 <= iVar22) {
          iVar27 = uVar38 + iVar42;
          iVar28 = uVar26 + iVar42;
          iVar18 = iVar21;
          do {
            if (iVar30 <= iVar11 + 1) {
              bVar60 = iVar42 == iVar35;
              bVar61 = iVar42 == iVar33;
              bVar62 = iVar18 == iVar23;
              bVar63 = iVar18 == iVar44;
              iVar12 = (a->begin).y;
              lVar53 = (long)iVar18;
              iVar13 = (a->begin).z;
              lVar15 = a->kstride;
              lVar34 = (iVar42 - iVar13) * lVar15;
              lVar29 = (iVar28 - iVar13) * lVar15;
              iVar45 = iVar18 + uVar38;
              lVar40 = (long)iVar42;
              lVar41 = (lVar40 - iVar13) * lVar15;
              iVar50 = uVar26 + iVar18;
              lVar16 = a->jstride;
              lVar58 = (iVar18 - iVar12) * lVar16;
              lVar51 = (iVar50 - iVar12) * lVar16;
              lVar47 = lVar16 * (lVar53 - iVar12);
              pdVar17 = a->p;
              pdVar1 = pdVar17 + lVar58 + lVar41;
              pdVar2 = pdVar17 + lVar51 + lVar41;
              pdVar3 = pdVar17 + lVar47 + lVar41;
              bVar59 = bflo->arr[1];
              bVar6 = bflo->arr[2];
              bVar7 = bfhi->arr[1];
              bVar8 = bfhi->arr[2];
              bVar9 = bflo->arr[0];
              iVar14 = (a->begin).x;
              lVar36 = (long)iVar14;
              bVar10 = bfhi->arr[0];
              lVar52 = (long)iVar30;
              do {
                if ((((int)local_c8 <= lVar52) && (local_c8._4_4_ <= iVar18)) &&
                   ((local_c0 <= iVar42 &&
                    (((lVar52 <= local_bc[0] && (iVar18 <= local_bc[1])) &&
                     (iVar42 <= (int)uStack_b4)))))) goto LAB_0068ebd5;
                iVar46 = (int)lVar52;
                pdVar25 = pdVar1;
                if ((lVar52 == lVar57 && iVar18 == iVar23) && iVar42 == iVar33) {
                  uVar32 = uVar26;
                  uVar20 = bVar9;
                  if ((bVar9 & 1U) == 0) {
                    if (((bVar59 | bVar6) & 1U) != 0) {
                      if ((bVar9 & 1U) != 0) goto LAB_0068e655;
                      goto joined_r0x0068ea3b;
                    }
                    goto LAB_0068e4f1;
                  }
LAB_0068e655:
                  if (((bVar59 & 1U) != 0) && ((bVar6 & 1U) != 0)) goto LAB_0068e69e;
                  if ((bVar9 & 1U) == 0) goto joined_r0x0068ea3b;
                  if ((bVar59 & 1U) != 0) goto LAB_0068e856;
                  if (((bVar9 & 1U) == 0) || ((bVar6 & 1U) == 0)) goto joined_r0x0068ea3b;
LAB_0068eb83:
                  uVar64 = SUB84(pdVar17[lVar47 + lVar29 + (int)((uVar32 + iVar46) - iVar14)],0);
                  uVar65 = (undefined4)
                           ((ulong)pdVar17[lVar47 + lVar29 + (int)((uVar32 + iVar46) - iVar14)] >>
                           0x20);
                  lVar54 = lVar52 - lVar36;
                  pdVar25 = pdVar17 + lVar47 + lVar34;
LAB_0068ebcf:
                  pdVar25[lVar54] = (double)CONCAT44(uVar65,uVar64);
                }
                else {
LAB_0068e4f1:
                  if ((lVar52 == lVar24 && iVar18 == iVar23) && iVar42 == iVar33) {
                    uVar32 = uVar38;
                    uVar20 = bVar10;
                    if ((bVar10 & 1U) == 0) {
                      if (((bVar59 | bVar6) & 1U) == 0) goto LAB_0068e516;
                      if ((bVar10 & 1U) == 0) goto joined_r0x0068ea3b;
                    }
                    if (((bVar59 & 1U) == 0) || ((bVar6 & 1U) == 0)) {
                      if ((bVar10 & 1U) != 0) {
                        if ((bVar59 & 1U) != 0) {
LAB_0068e856:
                          uVar64 = SUB84(pdVar2[(int)((uVar32 + iVar46) - iVar14)],0);
                          uVar65 = (undefined4)
                                   ((ulong)pdVar2[(int)((uVar32 + iVar46) - iVar14)] >> 0x20);
                          lVar54 = lVar52 - lVar36;
                          goto LAB_0068ebcf;
                        }
                        if (((bVar10 & 1U) != 0) && ((bVar6 & 1U) != 0)) goto LAB_0068eb83;
                      }
joined_r0x0068ea3b:
                      if (((bVar59 & 1U) == 0) || ((bVar6 & 1U) == 0)) {
                        if ((uVar20 & 1) == 0) {
                          if ((bVar59 & 1U) == 0) {
                            if ((bVar6 & 1U) != 0) {
                              pdVar17[lVar47 + (lVar52 - lVar36) + lVar34] =
                                   pdVar17[lVar47 + (lVar52 - lVar36) + lVar29];
                            }
                            goto LAB_0068ebd5;
                          }
                          lVar54 = lVar52 - lVar36;
                          uVar64 = SUB84(pdVar2[lVar54],0);
                          uVar65 = (undefined4)((ulong)pdVar2[lVar54] >> 0x20);
                        }
                        else {
                          uVar64 = SUB84(pdVar3[(int)((uVar32 + iVar46) - iVar14)],0);
                          uVar65 = (undefined4)
                                   ((ulong)pdVar3[(int)((uVar32 + iVar46) - iVar14)] >> 0x20);
                          lVar54 = lVar52 - lVar36;
                          pdVar25 = pdVar3;
                        }
                      }
                      else {
                        lVar54 = lVar52 - lVar36;
                        uVar64 = SUB84(pdVar17[lVar51 + lVar29 + lVar54],0);
                        uVar65 = (undefined4)((ulong)pdVar17[lVar51 + lVar29 + lVar54] >> 0x20);
                        pdVar25 = pdVar17 + lVar58 + lVar34;
                      }
                    }
                    else {
LAB_0068e69e:
                      uVar64 = SUB84(pdVar17[lVar51 + lVar29 + (int)((uVar32 + iVar46) - iVar14)],0)
                      ;
                      uVar65 = (undefined4)
                               ((ulong)pdVar17[lVar51 + lVar29 + (int)((uVar32 + iVar46) - iVar14)]
                               >> 0x20);
                      lVar54 = lVar52 - lVar36;
                      pdVar25 = pdVar17 + lVar58 + lVar34;
                    }
                    goto LAB_0068ebcf;
                  }
LAB_0068e516:
                  if ((iVar18 == iVar44 && lVar52 == lVar57) && iVar42 == iVar33) {
                    if ((bVar9 & 1U) == 0) {
                      if (((bVar7 | bVar6) & 1U) != 0) {
                        if ((bVar9 & 1U) != 0) goto LAB_0068e6de;
                        goto LAB_0068ee02;
                      }
                      goto LAB_0068e539;
                    }
LAB_0068e6de:
                    if (((bVar7 & 1U) != 0) && ((bVar6 & 1U) != 0)) {
                      iVar39 = (a->begin).x;
                      iVar43 = (a->begin).y;
                      iVar56 = (a->begin).z;
                      dVar5 = a->p[(long)(iVar45 - iVar43) * a->jstride +
                                   (long)(int)((uVar26 + iVar46) - iVar39) +
                                   (long)(iVar28 - iVar56) * a->kstride];
                      uVar64 = SUB84(dVar5,0);
                      uVar65 = (undefined4)((ulong)dVar5 >> 0x20);
                      lVar54 = (long)(iVar42 - iVar56) * a->kstride;
                      pdVar25 = a->p + (long)(iVar18 - iVar43) * a->jstride;
LAB_0068ed99:
                      pdVar25 = pdVar25 + (lVar52 - iVar39);
LAB_0068ef84:
                      pdVar25[lVar54] = (double)CONCAT44(uVar65,uVar64);
                      goto LAB_0068ebd5;
                    }
                    if ((bVar9 & 1U) != 0) {
                      if (bfhi->arr[1] == true) {
                        iVar43 = (a->begin).x;
                        iVar56 = (a->begin).y;
                        lVar54 = (lVar40 - (a->begin).z) * a->kstride;
                        a->p[(long)(iVar18 - iVar56) * a->jstride + (lVar52 - iVar43) + lVar54] =
                             a->p[(long)(iVar45 - iVar56) * a->jstride +
                                  (int)((uVar26 + iVar46) - iVar43) + lVar54];
                        goto LAB_0068ebd5;
                      }
                      if (((bVar9 & 1U) == 0) || (bflo->arr[2] != true)) goto LAB_0068ee02;
LAB_0068edcc:
                      iVar43 = (a->begin).x;
                      iVar39 = (uVar26 + iVar46) - iVar43;
                      lVar54 = (lVar53 - (a->begin).y) * a->jstride;
                      iVar46 = (a->begin).z;
                      iVar56 = iVar28;
LAB_0068f106:
                      uVar64 = SUB84(pdVar17[lVar54 + (long)iVar39 +
                                                      (long)(iVar56 - iVar46) * a->kstride],0);
                      uVar65 = (undefined4)
                               ((ulong)pdVar17[lVar54 + (long)iVar39 +
                                                        (long)(iVar56 - iVar46) * a->kstride] >>
                               0x20);
                      lVar49 = (long)(iVar42 - iVar46) * a->kstride;
                      pdVar25 = pdVar17 + lVar54 + (lVar52 - iVar43);
LAB_0068f90d:
                      pdVar25[lVar49] = (double)CONCAT44(uVar65,uVar64);
                      goto LAB_0068ebd5;
                    }
LAB_0068ee02:
                    cVar55 = bfhi->arr[1];
                    if (((bool)cVar55 == true) && (bflo->arr[2] == true)) {
LAB_0068ef06:
                      iVar43 = (a->begin).x;
                      iVar46 = (a->begin).y;
                      iVar56 = iVar45;
LAB_0068ef1d:
                      lVar49 = a->jstride;
                      LVar48 = a->kstride;
                      lVar54 = (iVar56 - iVar46) * lVar49;
                      iVar56 = (a->begin).z;
                      iVar39 = iVar28;
LAB_0068ef38:
                      uVar64 = SUB84(pdVar17[lVar54 + (lVar52 - iVar43) + (iVar39 - iVar56) * LVar48
                                            ],0);
                      uVar65 = (undefined4)
                               ((ulong)pdVar17[lVar54 + (lVar52 - iVar43) +
                                                        (iVar39 - iVar56) * LVar48] >> 0x20);
                      lVar54 = (iVar42 - iVar56) * LVar48;
                      pdVar25 = pdVar17 + (iVar18 - iVar46) * lVar49 + (lVar52 - iVar43);
                      goto LAB_0068ef84;
                    }
                    if ((bVar9 & 1U) != 0) {
LAB_0068ee26:
                      iVar43 = (a->begin).x;
                      lVar54 = (lVar53 - (a->begin).y) * a->jstride;
                      lVar49 = (lVar40 - (a->begin).z) * a->kstride;
                      uVar64 = SUB84(pdVar17[lVar54 + (int)((uVar26 + iVar46) - iVar43) + lVar49],0)
                      ;
                      uVar65 = (undefined4)
                               ((ulong)pdVar17[lVar54 + (int)((uVar26 + iVar46) - iVar43) + lVar49]
                               >> 0x20);
                      lVar54 = lVar54 + (lVar52 - iVar43);
                      goto LAB_0068eff6;
                    }
LAB_0068f001:
                    if (cVar55 == '\0') goto LAB_0068f8a3;
LAB_0068f00a:
                    iVar43 = (a->begin).x;
                    iVar46 = (a->begin).y;
                    iVar56 = iVar45;
LAB_0068f611:
                    lVar54 = (lVar40 - (a->begin).z) * a->kstride;
                    pdVar17[(long)(iVar18 - iVar46) * a->jstride + (lVar52 - iVar43) + lVar54] =
                         pdVar17[(long)(iVar56 - iVar46) * a->jstride + (lVar52 - iVar43) + lVar54];
                  }
                  else {
LAB_0068e539:
                    if ((iVar18 == iVar44 && lVar52 == lVar24) && iVar42 == iVar33) {
                      if ((bVar10 & 1U) == 0) {
                        if (((bVar7 | bVar6) & 1U) != 0) {
                          if ((bVar10 & 1U) != 0) goto LAB_0068e7d0;
                          goto LAB_0068eee8;
                        }
                        goto LAB_0068e562;
                      }
LAB_0068e7d0:
                      if ((bfhi->arr[1] == true) && (bflo->arr[2] == true)) {
                        iVar39 = (a->begin).x;
                        iVar43 = (a->begin).y;
                        lVar49 = a->jstride;
                        LVar48 = a->kstride;
                        iVar56 = (a->begin).z;
                        lVar54 = (iVar45 - iVar43) * lVar49 +
                                 (long)(int)((uVar38 + iVar46) - iVar39);
                        iVar46 = iVar28;
LAB_0068ed58:
                        uVar64 = SUB84((pdVar17 + lVar54)[(iVar46 - iVar56) * LVar48],0);
                        uVar65 = (undefined4)
                                 ((ulong)(pdVar17 + lVar54)[(iVar46 - iVar56) * LVar48] >> 0x20);
                        lVar54 = (iVar42 - iVar56) * LVar48;
                        pdVar25 = pdVar17 + (iVar18 - iVar43) * lVar49;
                        goto LAB_0068ed99;
                      }
                      if ((bVar10 & 1U) == 0) {
LAB_0068eee8:
                        cVar55 = bfhi->arr[1];
                        if (((bool)cVar55 == true) && (bflo->arr[2] == true)) goto LAB_0068ef06;
                        if ((bVar10 & 1U) == 0) goto LAB_0068f001;
LAB_0068ef9b:
                        iVar43 = (a->begin).x;
                        lVar54 = (lVar53 - (a->begin).y) * a->jstride;
                        lVar49 = (lVar40 - (a->begin).z) * a->kstride;
                        uVar64 = SUB84(pdVar17[lVar54 + (int)((uVar38 + iVar46) - iVar43) + lVar49],
                                       0);
                        uVar65 = (undefined4)
                                 ((ulong)pdVar17[lVar54 + (int)((uVar38 + iVar46) - iVar43) + lVar49
                                                ] >> 0x20);
                        lVar54 = lVar54 + (lVar52 - iVar43);
LAB_0068eff6:
                        (pdVar17 + lVar54)[lVar49] = (double)CONCAT44(uVar65,uVar64);
                        goto LAB_0068ebd5;
                      }
                      if (bfhi->arr[1] == true) {
LAB_0068e9ac:
                        iVar43 = (a->begin).x;
                        iVar39 = (uVar38 + iVar46) - iVar43;
                        iVar46 = (a->begin).y;
                        iVar56 = iVar45;
LAB_0068f4b5:
                        lVar54 = (lVar40 - (a->begin).z) * a->kstride;
                        pdVar17[(long)(iVar18 - iVar46) * a->jstride + (lVar52 - iVar43) + lVar54] =
                             pdVar17[(long)(iVar56 - iVar46) * a->jstride + iVar39 + lVar54];
                        goto LAB_0068ebd5;
                      }
                      if (((bVar10 & 1U) == 0) || (bflo->arr[2] != true)) goto LAB_0068eee8;
LAB_0068eeb2:
                      iVar43 = (a->begin).x;
                      iVar39 = (uVar38 + iVar46) - iVar43;
                      lVar49 = (lVar53 - (a->begin).y) * a->jstride;
                      iVar46 = (a->begin).z;
                      iVar56 = iVar28;
LAB_0068f349:
                      uVar64 = SUB84(pdVar17[lVar49 + (long)iVar39 +
                                                      (long)(iVar56 - iVar46) * a->kstride],0);
                      uVar65 = (undefined4)
                               ((ulong)pdVar17[lVar49 + (long)iVar39 +
                                                        (long)(iVar56 - iVar46) * a->kstride] >>
                               0x20);
                      lVar54 = (long)(iVar42 - iVar46) * a->kstride;
                      pdVar25 = pdVar17 + lVar49 + (lVar52 - iVar43);
LAB_0068f38e:
                      pdVar25[lVar54] = (double)CONCAT44(uVar65,uVar64);
                      goto LAB_0068ebd5;
                    }
LAB_0068e562:
                    if ((iVar18 != iVar23 || lVar52 != lVar57) || iVar42 != iVar35) {
LAB_0068e589:
                      if ((iVar18 == iVar23 && lVar52 == lVar24) && iVar42 == iVar35) {
                        if ((bVar10 & 1U) == 0) {
                          if (((bVar59 | bVar8) & 1U) != 0) {
                            if ((bVar10 & 1U) != 0) goto LAB_0068e9dc;
                            goto LAB_0068ecb2;
                          }
                          goto LAB_0068e5b7;
                        }
LAB_0068e9dc:
                        if ((bflo->arr[1] == true) && (bfhi->arr[2] == true)) {
                          iVar39 = (a->begin).x;
                          iVar31 = (uVar38 + iVar46) - iVar39;
                          iVar43 = (a->begin).y;
                          iVar46 = iVar50;
LAB_0068ed30:
                          lVar49 = a->jstride;
                          LVar48 = a->kstride;
                          iVar56 = (a->begin).z;
                          lVar54 = (iVar46 - iVar43) * lVar49 + (long)iVar31;
                          iVar46 = iVar27;
                          goto LAB_0068ed58;
                        }
                        if ((bVar10 & 1U) != 0) {
                          if (bflo->arr[1] == true) {
LAB_0068f495:
                            iVar43 = (a->begin).x;
                            iVar39 = (uVar38 + iVar46) - iVar43;
                            iVar46 = (a->begin).y;
                            iVar56 = iVar50;
                            goto LAB_0068f4b5;
                          }
                          if (((bVar10 & 1U) == 0) || (bfhi->arr[2] != true)) goto LAB_0068ecb2;
LAB_0068f318:
                          iVar43 = (a->begin).x;
                          iVar39 = (uVar38 + iVar46) - iVar43;
                          lVar49 = (lVar53 - (a->begin).y) * a->jstride;
                          iVar46 = (a->begin).z;
                          iVar56 = iVar27;
                          goto LAB_0068f349;
                        }
LAB_0068ecb2:
                        if ((bflo->arr[1] == true) && (bfhi->arr[2] == true)) {
LAB_0068ecd1:
                          iVar43 = (a->begin).x;
                          iVar46 = (a->begin).y;
                          iVar56 = iVar50;
                          goto LAB_0068f3c3;
                        }
                        if ((bVar10 & 1U) != 0) goto LAB_0068ef9b;
                        if (bflo->arr[1] == false) goto LAB_0068f3f7;
                      }
                      else {
LAB_0068e5b7:
                        if ((iVar18 == iVar44 && lVar52 == lVar57) && iVar42 == iVar35) {
                          if ((bVar9 & 1U) == 0) {
                            if (((bVar7 | bVar8) & 1U) != 0) {
                              if ((bVar9 & 1U) != 0) goto LAB_0068eac2;
                              goto LAB_0068f04a;
                            }
                            goto LAB_0068e5de;
                          }
LAB_0068eac2:
                          if ((bfhi->arr[1] == true) && (bfhi->arr[2] == true)) {
                            iVar43 = (a->begin).x;
                            iVar39 = (uVar26 + iVar46) - iVar43;
                            iVar46 = (a->begin).y;
                            iVar56 = iVar45;
                            goto LAB_0068eafa;
                          }
                          if ((bVar9 & 1U) == 0) {
LAB_0068f04a:
                            if ((bfhi->arr[1] != true) || (bfhi->arr[2] != true)) {
                              if ((bVar9 & 1U) == 0) {
                                if (bfhi->arr[1] == false) goto LAB_0068f2d4;
                                iVar43 = (a->begin).x;
                                iVar46 = (a->begin).y;
                                iVar56 = iVar45;
                                goto LAB_0068f27a;
                              }
                              goto LAB_0068f1fd;
                            }
                            iVar43 = (a->begin).x;
                            iVar46 = (a->begin).y;
                            iVar56 = iVar45;
                            goto LAB_0068f185;
                          }
                          if (bfhi->arr[1] != true) {
                            if (((bVar9 & 1U) != 0) && (bfhi->arr[2] == true)) goto LAB_0068f0d5;
                            goto LAB_0068f04a;
                          }
LAB_0068f561:
                          iVar43 = (a->begin).x;
                          iVar39 = (uVar26 + iVar46) - iVar43;
                          iVar46 = (a->begin).y;
                          iVar56 = iVar45;
LAB_0068f581:
                          lVar54 = (lVar40 - (a->begin).z) * a->kstride;
                          pdVar17[(long)(iVar18 - iVar46) * a->jstride + (lVar52 - iVar43) + lVar54]
                               = pdVar17[(long)(iVar56 - iVar46) * a->jstride + iVar39 + lVar54];
                          goto LAB_0068ebd5;
                        }
LAB_0068e5de:
                        if ((iVar18 == iVar44 && lVar52 == lVar24) && iVar42 == iVar35) {
                          if ((bVar10 & 1U) == 0) {
                            if (((bVar7 | bVar8) & 1U) == 0) goto LAB_0068e60c;
                            if ((bVar10 & 1U) != 0) goto LAB_0068ecf8;
                          }
                          else {
LAB_0068ecf8:
                            if ((bfhi->arr[1] == true) && (bfhi->arr[2] == true)) {
                              iVar39 = (a->begin).x;
                              iVar31 = (uVar38 + iVar46) - iVar39;
                              iVar43 = (a->begin).y;
                              iVar46 = iVar45;
                              goto LAB_0068ed30;
                            }
                            if ((bVar10 & 1U) != 0) {
                              if (bfhi->arr[1] == true) goto LAB_0068e9ac;
                              if (((bVar10 & 1U) != 0) && (bfhi->arr[2] == true)) goto LAB_0068f318;
                            }
                          }
                          if ((bfhi->arr[1] != true) || (bfhi->arr[2] != true)) {
                            if ((bVar10 & 1U) != 0) goto LAB_0068ef9b;
                            if (bfhi->arr[1] != false) goto LAB_0068f00a;
                            goto LAB_0068f3f7;
                          }
LAB_0068f3ac:
                          iVar43 = (a->begin).x;
                          iVar46 = (a->begin).y;
                          iVar56 = iVar45;
LAB_0068f3c3:
                          lVar49 = a->jstride;
                          LVar48 = a->kstride;
                          lVar54 = (iVar56 - iVar46) * lVar49;
                          iVar56 = (a->begin).z;
                          iVar39 = iVar27;
                          goto LAB_0068ef38;
                        }
LAB_0068e60c:
                        if (iVar18 == iVar23 && lVar52 == lVar57) {
                          if ((bVar9 & 1U) == 0) {
                            if ((bVar59 & 1U) == 0) goto LAB_0068f459;
                            if ((bVar9 & 1U) != 0) goto LAB_0068e631;
                          }
                          else {
LAB_0068e631:
                            if (bflo->arr[1] == true) goto LAB_0068ea93;
                            if ((bVar9 & 1U) != 0) goto LAB_0068f1fd;
                          }
                          cVar55 = bflo->arr[1];
                        }
                        else {
LAB_0068f459:
                          if (iVar18 != iVar23 || lVar52 != lVar24) {
LAB_0068f530:
                            if (iVar18 == iVar44 && lVar52 == lVar57) {
                              if ((bVar9 & 1U) == 0) {
                                if ((bVar7 & 1U) == 0) goto LAB_0068f683;
                                if ((bVar9 & 1U) != 0) goto LAB_0068f555;
                              }
                              else {
LAB_0068f555:
                                if (bfhi->arr[1] == true) goto LAB_0068f561;
                                if ((bVar9 & 1U) != 0) goto LAB_0068f1fd;
                              }
                              cVar55 = bfhi->arr[1];
                            }
                            else {
LAB_0068f683:
                              if (iVar18 != iVar44 || lVar52 != lVar24) {
LAB_0068f700:
                                if ((lVar52 == lVar57) && (iVar42 == iVar33)) {
                                  if ((bVar9 & 1U) == 0) {
                                    if ((bVar6 & 1U) == 0) goto LAB_0068f741;
                                    if ((bVar9 & 1U) == 0) goto LAB_0068f8a3;
                                  }
                                  if (bflo->arr[2] == true) goto LAB_0068edcc;
                                  if ((bVar9 & 1U) != 0) goto LAB_0068ee26;
                                }
                                else {
LAB_0068f741:
                                  if ((lVar52 != lVar24) || (iVar42 != iVar33)) {
LAB_0068f787:
                                    if ((lVar52 == lVar57) && (iVar42 == iVar35)) {
                                      if ((bVar9 & 1U) == 0) {
                                        if ((bVar8 & 1U) == 0) goto LAB_0068f7cb;
                                        if ((bVar9 & 1U) == 0) goto LAB_0068f3f7;
                                      }
                                      if (bfhi->arr[2] == true) goto LAB_0068f0d5;
                                      if ((bVar9 & 1U) != 0) goto LAB_0068ee26;
                                    }
                                    else {
LAB_0068f7cb:
                                      if ((lVar52 != lVar24) || (iVar42 != iVar35)) {
LAB_0068f814:
                                        if (bVar62 && bVar61) {
                                          if ((bVar59 & 1U) == 0) {
                                            if ((bVar6 & 1U) == 0) goto LAB_0068f857;
                                            if ((bVar59 & 1U) == 0) goto LAB_0068f8a3;
                                          }
                                          if (bflo->arr[2] != true) {
                                            if ((bVar59 & 1U) != 0) goto LAB_0068f5fa;
                                            goto LAB_0068f8a3;
                                          }
                                          iVar43 = (a->begin).x;
                                          iVar46 = (a->begin).y;
                                          iVar56 = iVar50;
                                          goto LAB_0068ef1d;
                                        }
LAB_0068f857:
                                        if (bVar63 && bVar61) {
                                          if ((bVar7 & 1U) == 0) {
                                            if ((bVar6 & 1U) == 0) goto LAB_0068f91d;
                                            if ((bVar7 & 1U) == 0) goto LAB_0068f8a3;
                                          }
                                          if (bflo->arr[2] == true) goto LAB_0068ef06;
                                          if ((bVar7 & 1U) != 0) goto LAB_0068f00a;
                                          goto LAB_0068f8a3;
                                        }
LAB_0068f91d:
                                        if (bVar62 && bVar60) {
                                          if ((bVar59 & 1U) == 0) {
                                            if ((bVar8 & 1U) == 0) goto LAB_0068f958;
                                            if ((bVar59 & 1U) == 0) goto LAB_0068f3f7;
                                          }
                                          if (bfhi->arr[2] == true) goto LAB_0068ecd1;
                                          if ((bVar59 & 1U) != 0) goto LAB_0068f5fa;
                                          goto LAB_0068f3f7;
                                        }
LAB_0068f958:
                                        if (bVar63 && bVar60) {
                                          if ((bVar7 & 1U) == 0) {
                                            if ((bVar8 & 1U) == 0) goto LAB_0068f9f5;
                                            if ((bVar7 & 1U) != 0) goto LAB_0068f96a;
                                          }
                                          else {
LAB_0068f96a:
                                            if ((bVar8 & 1U) != 0) goto LAB_0068f3ac;
                                            if ((bVar7 & 1U) != 0) goto LAB_0068f00a;
                                          }
                                          if ((bVar8 & 1U) != 0) {
                                            iVar46 = (a->begin).z;
                                            pdVar25 = pdVar17 + a->jstride * (lVar53 - iVar12) +
                                                                (lVar52 - lVar36);
                                            uVar64 = SUB84(pdVar25[(long)(iVar27 - iVar46) *
                                                                   a->kstride],0);
                                            uVar65 = (undefined4)
                                                     ((ulong)pdVar25[(long)(iVar27 - iVar46) *
                                                                     a->kstride] >> 0x20);
                                            lVar54 = (long)(iVar42 - iVar46) * a->kstride;
                                            goto LAB_0068f38e;
                                          }
                                        }
                                        else {
LAB_0068f9f5:
                                          if (((lVar52 == lVar57) &&
                                              (uVar32 = uVar26, (bVar9 & 1U) != 0)) ||
                                             ((lVar52 == lVar24 &&
                                              (uVar32 = uVar38, (bVar10 & 1U) != 0)))) {
                                            uVar64 = SUB84(pdVar3[(int)((uVar32 + iVar46) - iVar14)]
                                                           ,0);
                                            uVar65 = (undefined4)
                                                     ((ulong)pdVar3[(int)((uVar32 + iVar46) - iVar14
                                                                         )] >> 0x20);
                                            lVar54 = lVar52 - lVar36;
                                            pdVar25 = pdVar3;
                                          }
                                          else {
                                            pdVar25 = pdVar2;
                                            if (((bVar62 & bVar59) == 0) &&
                                               (pdVar25 = pdVar17 + (iVar45 - iVar12) * lVar16 +
                                                                    lVar41, (bVar63 & bVar7) == 0))
                                            {
                                              if ((bVar61 & bVar6) == 0) {
                                                if ((bVar60 & bVar8) == 0) goto LAB_0068ebd5;
                                                pdVar25 = pdVar17 + lVar47 + (lVar52 - lVar36);
                                                uVar64 = SUB84(pdVar25[(iVar27 - iVar13) * lVar15],0
                                                              );
                                                uVar65 = (undefined4)
                                                         ((ulong)pdVar25[(iVar27 - iVar13) * lVar15]
                                                         >> 0x20);
                                              }
                                              else {
                                                pdVar25 = pdVar17 + lVar47 + (lVar52 - lVar36);
                                                uVar64 = SUB84(pdVar25[lVar29],0);
                                                uVar65 = (undefined4)
                                                         ((ulong)pdVar25[lVar29] >> 0x20);
                                              }
                                              pdVar25[lVar34] = (double)CONCAT44(uVar65,uVar64);
                                              goto LAB_0068ebd5;
                                            }
                                            lVar54 = lVar52 - lVar36;
                                            uVar64 = SUB84(pdVar25[lVar54],0);
                                            uVar65 = (undefined4)((ulong)pdVar25[lVar54] >> 0x20);
                                            pdVar25 = pdVar1;
                                          }
                                          pdVar25[lVar54] = (double)CONCAT44(uVar65,uVar64);
                                        }
                                        goto LAB_0068ebd5;
                                      }
                                      if ((bVar10 & 1U) == 0) {
                                        if ((bVar8 & 1U) == 0) goto LAB_0068f814;
                                        if ((bVar10 & 1U) == 0) goto LAB_0068f3f7;
                                      }
                                      if (bfhi->arr[2] == true) goto LAB_0068f318;
                                      if ((bVar10 & 1U) != 0) goto LAB_0068ef9b;
                                    }
LAB_0068f3f7:
                                    if (bfhi->arr[2] == true) goto LAB_0068f403;
                                    goto LAB_0068ebd5;
                                  }
                                  if ((bVar10 & 1U) == 0) {
                                    if ((bVar6 & 1U) == 0) goto LAB_0068f787;
                                    if ((bVar10 & 1U) == 0) goto LAB_0068f8a3;
                                  }
                                  if (bflo->arr[2] == true) goto LAB_0068eeb2;
                                  if ((bVar10 & 1U) != 0) goto LAB_0068ef9b;
                                }
LAB_0068f8a3:
                                if (bflo->arr[2] == true) {
                                  iVar43 = (a->begin).x;
                                  lVar54 = (lVar53 - (a->begin).y) * a->jstride;
                                  iVar46 = (a->begin).z;
                                  iVar56 = iVar28;
                                  goto LAB_0068f8da;
                                }
                                goto LAB_0068ebd5;
                              }
                              if ((bVar10 & 1U) == 0) {
                                if ((bVar7 & 1U) == 0) goto LAB_0068f700;
                                if ((bVar10 & 1U) != 0) goto LAB_0068f6a8;
                              }
                              else {
LAB_0068f6a8:
                                if (bfhi->arr[1] == true) goto LAB_0068e9ac;
                                if ((bVar10 & 1U) != 0) goto LAB_0068ef9b;
                              }
                              cVar55 = bfhi->arr[1];
                            }
                            if (cVar55 == '\x01') goto LAB_0068f00a;
                            goto LAB_0068ebd5;
                          }
                          if ((bVar10 & 1U) == 0) {
                            if ((bVar59 & 1U) == 0) goto LAB_0068f530;
                            if ((bVar10 & 1U) != 0) goto LAB_0068f486;
                          }
                          else {
LAB_0068f486:
                            if (bflo->arr[1] == true) goto LAB_0068f495;
                            if ((bVar10 & 1U) != 0) goto LAB_0068ef9b;
                          }
                          cVar55 = bflo->arr[1];
                        }
                        if (cVar55 != '\x01') goto LAB_0068ebd5;
                      }
LAB_0068f5fa:
                      iVar43 = (a->begin).x;
                      iVar46 = (a->begin).y;
                      iVar56 = iVar50;
                      goto LAB_0068f611;
                    }
                    if ((bVar9 & 1U) == 0) {
                      if (((bVar59 | bVar8) & 1U) != 0) {
                        if ((bVar9 & 1U) != 0) goto LAB_0068e89a;
                        goto LAB_0068f14f;
                      }
                      goto LAB_0068e589;
                    }
LAB_0068e89a:
                    if ((bflo->arr[1] == true) && (bfhi->arr[2] == true)) {
                      iVar43 = (a->begin).x;
                      iVar39 = (uVar26 + iVar46) - iVar43;
                      iVar46 = (a->begin).y;
                      iVar56 = iVar50;
LAB_0068eafa:
                      iVar31 = (a->begin).z;
                      uVar64 = SUB84(pdVar17[(long)(iVar56 - iVar46) * a->jstride +
                                             (long)iVar39 + (long)(iVar27 - iVar31) * a->kstride],0)
                      ;
                      uVar65 = (undefined4)
                               ((ulong)pdVar17[(long)(iVar56 - iVar46) * a->jstride +
                                               (long)iVar39 + (long)(iVar27 - iVar31) * a->kstride]
                               >> 0x20);
                      lVar49 = (long)(iVar42 - iVar31) * a->kstride;
                      lVar54 = (long)(iVar18 - iVar46) * a->jstride + (lVar52 - iVar43);
LAB_0068f1ec:
                      (pdVar17 + lVar54)[lVar49] = (double)CONCAT44(uVar65,uVar64);
                      goto LAB_0068ebd5;
                    }
                    if ((bVar9 & 1U) != 0) {
                      if (bflo->arr[1] == true) {
LAB_0068ea93:
                        iVar43 = (a->begin).x;
                        iVar39 = (uVar26 + iVar46) - iVar43;
                        iVar46 = (a->begin).y;
                        iVar56 = iVar50;
                        goto LAB_0068f581;
                      }
                      if (((bVar9 & 1U) == 0) || (bfhi->arr[2] != true)) goto LAB_0068f14f;
LAB_0068f0d5:
                      iVar43 = (a->begin).x;
                      iVar39 = (uVar26 + iVar46) - iVar43;
                      lVar54 = (lVar53 - (a->begin).y) * a->jstride;
                      iVar46 = (a->begin).z;
                      iVar56 = iVar27;
                      goto LAB_0068f106;
                    }
LAB_0068f14f:
                    if ((bflo->arr[1] == true) && (bfhi->arr[2] == true)) {
                      iVar43 = (a->begin).x;
                      iVar46 = (a->begin).y;
                      iVar56 = iVar50;
LAB_0068f185:
                      iVar39 = (a->begin).z;
                      uVar64 = SUB84(pdVar17[(long)(iVar56 - iVar46) * a->jstride +
                                             (lVar52 - iVar43) +
                                             (long)(iVar27 - iVar39) * a->kstride],0);
                      uVar65 = (undefined4)
                               ((ulong)pdVar17[(long)(iVar56 - iVar46) * a->jstride +
                                               (lVar52 - iVar43) +
                                               (long)(iVar27 - iVar39) * a->kstride] >> 0x20);
                      lVar49 = (long)(iVar42 - iVar39) * a->kstride;
                      lVar54 = (long)(iVar18 - iVar46) * a->jstride + (lVar52 - iVar43);
                      goto LAB_0068f1ec;
                    }
                    if ((bVar9 & 1U) == 0) {
                      if (bflo->arr[1] == false) {
LAB_0068f2d4:
                        if (bfhi->arr[2] != true) goto LAB_0068ebd5;
LAB_0068f403:
                        iVar43 = (a->begin).x;
                        lVar54 = (lVar53 - (a->begin).y) * a->jstride;
                        iVar46 = (a->begin).z;
                        iVar56 = iVar27;
LAB_0068f8da:
                        pdVar25 = pdVar17 + lVar54 + (lVar52 - iVar43);
                        uVar64 = SUB84(pdVar25[(long)(iVar56 - iVar46) * a->kstride],0);
                        uVar65 = (undefined4)
                                 ((ulong)pdVar25[(long)(iVar56 - iVar46) * a->kstride] >> 0x20);
                        lVar49 = (long)(iVar42 - iVar46) * a->kstride;
                        goto LAB_0068f90d;
                      }
                      iVar43 = (a->begin).x;
                      iVar46 = (a->begin).y;
                      iVar56 = iVar50;
LAB_0068f27a:
                      lVar54 = (lVar40 - (a->begin).z) * a->kstride;
                      pdVar17[(long)(iVar18 - iVar46) * a->jstride + (lVar52 - iVar43) + lVar54] =
                           pdVar17[(long)(iVar56 - iVar46) * a->jstride + (lVar52 - iVar43) + lVar54
                                  ];
                    }
                    else {
LAB_0068f1fd:
                      iVar43 = (a->begin).x;
                      lVar54 = (lVar53 - (a->begin).y) * a->jstride;
                      lVar49 = (lVar40 - (a->begin).z) * a->kstride;
                      pdVar17[lVar54 + (lVar52 - iVar43) + lVar49] =
                           pdVar17[lVar54 + (int)((uVar26 + iVar46) - iVar43) + lVar49];
                    }
                  }
                }
LAB_0068ebd5:
                lVar52 = lVar52 + 1;
              } while (iVar11 + 2 != (int)lVar52);
            }
            bVar59 = iVar18 != iVar22;
            iVar18 = iVar18 + 1;
          } while (bVar59);
        }
        bVar59 = iVar42 != iVar37;
        iVar42 = iVar42 + 1;
      } while (bVar59);
    }
  }
  return;
}

Assistant:

inline void mlndlap_bc_doit (Box const& vbx, Array4<T> const& a, Box const& domain,
                             GpuArray<bool,AMREX_SPACEDIM> const& bflo,
                             GpuArray<bool,AMREX_SPACEDIM> const& bfhi) noexcept
{
    Box gdomain = domain;
    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
        if (! bflo[idim]) gdomain.growLo(idim,1);
        if (! bfhi[idim]) gdomain.growHi(idim,1);
    }

    if (gdomain.strictly_contains(vbx)) return;

    const int offset = domain.cellCentered() ? 0 : 1;

    const auto dlo = amrex::lbound(domain);
    const auto dhi = amrex::ubound(domain);

    Box const& sbox = amrex::grow(vbx,1);
    AMREX_HOST_DEVICE_FOR_3D(sbox, i, j, k,
    {
        if (! gdomain.contains(IntVect(i,j,k))) {
            // xlo & ylo & zlo
            if (i == dlo.x-1 && j == dlo.y-1 && k == dlo.z-1 && (bflo[0] || bflo[1] || bflo[2]))
            {
                if (bflo[0] && bflo[1] && bflo[2])
                {
                    a(i,j,k) = a(i+1+offset, j+1+offset, k+1+offset);
                }
                else if (bflo[0] && bflo[1])
                {
                    a(i,j,k) = a(i+1+offset, j+1+offset, k);
                }
                else if (bflo[0] && bflo[2])
                {
                    a(i,j,k) = a(i+1+offset, j, k+1+offset);
                }
                else if (bflo[1] && bflo[2])
                {
                    a(i,j,k) = a(i, j+1+offset, k+1+offset);
                }
                else if (bflo[0])
                {
                    a(i,j,k) = a(i+1+offset, j, k);
                }
                else if (bflo[1])
                {
                    a(i,j,k) = a(i, j+1+offset, k);
                }
                else if (bflo[2])
                {
                    a(i,j,k) = a(i, j, k+1+offset);
                }
            }
            // xhi & ylo & zlo
            else if (i == dhi.x+1 && j == dlo.y-1 && k == dlo.z-1 && (bfhi[0] || bflo[1] || bflo[2]))
            {
                if (bfhi[0] && bflo[1] && bflo[2])
                {
                    a(i,j,k) = a(i-1-offset, j+1+offset, k+1+offset);
                }
                else if (bfhi[0] && bflo[1])
                {
                    a(i,j,k) = a(i-1-offset, j+1+offset, k);
                }
                else if (bfhi[0] && bflo[2])
                {
                    a(i,j,k) = a(i-1-offset, j, k+1+offset);
                }
                else if (bflo[1] && bflo[2])
                {
                    a(i,j,k) = a(i, j+1+offset, k+1+offset);
                }
                else if (bfhi[0])
                {
                    a(i,j,k) = a(i-1-offset, j, k);
                }
                else if (bflo[1])
                {
                    a(i,j,k) = a(i, j+1+offset, k);
                }
                else if (bflo[2])
                {
                    a(i,j,k) = a(i, j, k+1+offset);
                }
            }
            // xlo & yhi & zlo
            else if (i == dlo.x-1 && j == dhi.y+1 && k == dlo.z-1 && (bflo[0] || bfhi[1] || bflo[2]))
            {
                if (bflo[0] && bfhi[1] && bflo[2])
                {
                    a(i,j,k) = a(i+1+offset, j-1-offset, k+1+offset);
                }
                else if (bflo[0] && bfhi[1])
                {
                    a(i,j,k) = a(i+1+offset, j-1-offset, k);
                }
                else if (bflo[0] && bflo[2])
                {
                    a(i,j,k) = a(i+1+offset, j, k+1+offset);
                }
                else if (bfhi[1] && bflo[2])
                {
                    a(i,j,k) = a(i, j-1-offset, k+1+offset);
                }
                else if (bflo[0])
                {
                    a(i,j,k) = a(i+1+offset, j, k);
                }
                else if (bfhi[1])
                {
                    a(i,j,k) = a(i, j-1-offset, k);
                }
                else if (bflo[2])
                {
                    a(i,j,k) = a(i, j, k+1+offset);
                }
            }
            // xhi & yhi & zlo
            else if (i == dhi.x+1 && j == dhi.y+1 && k == dlo.z-1 && (bfhi[0] || bfhi[1] || bflo[2]))
            {
                if (bfhi[0] && bfhi[1] && bflo[2])
                {
                    a(i,j,k) = a(i-1-offset, j-1-offset, k+1+offset);
                }
                else if (bfhi[0] && bfhi[1])
                {
                    a(i,j,k) = a(i-1-offset, j-1-offset, k);
                }
                else if (bfhi[0] && bflo[2])
                {
                    a(i,j,k) = a(i-1-offset, j, k+1+offset);
                }
                else if (bfhi[1] && bflo[2])
                {
                    a(i,j,k) = a(i, j-1-offset, k+1+offset);
                }
                else if (bfhi[0])
                {
                    a(i,j,k) = a(i-1-offset, j, k);
                }
                else if (bfhi[1])
                {
                    a(i,j,k) = a(i, j-1-offset, k);
                }
                else if (bflo[2])
                {
                    a(i,j,k) = a(i, j, k+1+offset);
                }
            }
            // xlo & ylo & zhi
            else if (i == dlo.x-1 && j == dlo.y-1 && k == dhi.z+1 && (bflo[0] || bflo[1] || bfhi[2]))
            {
                if (bflo[0] && bflo[1] && bfhi[2])
                {
                    a(i,j,k) = a(i+1+offset, j+1+offset, k-1-offset);
                }
                else if (bflo[0] && bflo[1])
                {
                    a(i,j,k) = a(i+1+offset, j+1+offset, k);
                }
                else if (bflo[0] && bfhi[2])
                {
                    a(i,j,k) = a(i+1+offset, j, k-1-offset);
                }
                else if (bflo[1] && bfhi[2])
                {
                    a(i,j,k) = a(i, j+1+offset, k-1-offset);
                }
                else if (bflo[0])
                {
                    a(i,j,k) = a(i+1+offset, j, k);
                }
                else if (bflo[1])
                {
                    a(i,j,k) = a(i, j+1+offset, k);
                }
                else if (bfhi[2])
                {
                    a(i,j,k) = a(i, j, k-1-offset);
                }
            }
            // xhi & ylo & zhi
            else if (i == dhi.x+1 && j == dlo.y-1 && k == dhi.z+1 && (bfhi[0] || bflo[1] || bfhi[2]))
            {
                if (bfhi[0] && bflo[1] && bfhi[2])
                {
                    a(i,j,k) = a(i-1-offset, j+1+offset, k-1-offset);
                }
                else if (bfhi[0] && bflo[1])
                {
                    a(i,j,k) = a(i-1-offset, j+1+offset, k);
                }
                else if (bfhi[0] && bfhi[2])
                {
                    a(i,j,k) = a(i-1-offset, j, k-1-offset);
                }
                else if (bflo[1] && bfhi[2])
                {
                    a(i,j,k) = a(i, j+1+offset, k-1-offset);
                }
                else if (bfhi[0])
                {
                    a(i,j,k) = a(i-1-offset, j, k);
                }
                else if (bflo[1])
                {
                    a(i,j,k) = a(i, j+1+offset, k);
                }
                else if (bfhi[2])
                {
                    a(i,j,k) = a(i, j, k-1-offset);
                }
            }
            // xlo & yhi & zhi
            else if (i == dlo.x-1 && j == dhi.y+1 && k == dhi.z+1 && (bflo[0] || bfhi[1] || bfhi[2]))
            {
                if (bflo[0] && bfhi[1] && bfhi[2])
                {
                    a(i,j,k) = a(i+1+offset, j-1-offset, k-1-offset);
                }
                else if (bflo[0] && bfhi[1])
                {
                    a(i,j,k) = a(i+1+offset, j-1-offset, k);
                }
                else if (bflo[0] && bfhi[2])
                {
                    a(i,j,k) = a(i+1+offset, j, k-1-offset);
                }
                else if (bfhi[1] && bfhi[2])
                {
                    a(i,j,k) = a(i, j-1-offset, k-1-offset);
                }
                else if (bflo[0])
                {
                    a(i,j,k) = a(i+1+offset, j, k);
                }
                else if (bfhi[1])
                {
                    a(i,j,k) = a(i, j-1-offset, k);
                }
                else if (bfhi[2])
                {
                    a(i,j,k) = a(i, j, k-1-offset);
                }
            }
            // xhi & yhi & zhi
            else if (i == dhi.x+1 && j == dhi.y+1 && k == dhi.z+1 && (bfhi[0] || bfhi[1] || bfhi[2]))
            {
                if (bfhi[0] && bfhi[1] && bfhi[2])
                {
                    a(i,j,k) = a(i-1-offset, j-1-offset, k-1-offset);
                }
                else if (bfhi[0] && bfhi[1])
                {
                    a(i,j,k) = a(i-1-offset, j-1-offset, k);
                }
                else if (bfhi[0] && bfhi[2])
                {
                    a(i,j,k) = a(i-1-offset, j, k-1-offset);
                }
                else if (bfhi[1] && bfhi[2])
                {
                    a(i,j,k) = a(i, j-1-offset, k-1-offset);
                }
                else if (bfhi[0])
                {
                    a(i,j,k) = a(i-1-offset, j, k);
                }
                else if (bfhi[1])
                {
                    a(i,j,k) = a(i, j-1-offset, k);
                }
                else if (bfhi[2])
                {
                    a(i,j,k) = a(i, j, k-1-offset);
                }
            }
            // xlo & ylo
            else if (i == dlo.x-1 && j == dlo.y-1 && (bflo[0] || bflo[1]))
            {
                if (bflo[0] && bflo[1])
                {
                    a(i,j,k) = a(i+1+offset, j+1+offset, k);
                }
                else if (bflo[0])
                {
                    a(i,j,k) = a(i+1+offset, j, k);
                }
                else if (bflo[1])
                {
                    a(i,j,k) = a(i, j+1+offset, k);
                }
            }
            // xhi & ylo
            else if (i == dhi.x+1 && j == dlo.y-1 && (bfhi[0] || bflo[1]))
            {
                if (bfhi[0] && bflo[1])
                {
                    a(i,j,k) = a(i-1-offset, j+1+offset, k);
                }
                else if (bfhi[0])
                {
                    a(i,j,k) = a(i-1-offset, j, k);
                }
                else if (bflo[1])
                {
                    a(i,j,k) = a(i, j+1+offset, k);
                }
            }
            // xlo & yhi
            else if (i == dlo.x-1 && j == dhi.y+1 && (bflo[0] || bfhi[1]))
            {
                if (bflo[0] && bfhi[1])
                {
                    a(i,j,k) = a(i+1+offset, j-1-offset, k);
                }
                else if (bflo[0])
                {
                    a(i,j,k) = a(i+1+offset, j, k);
                }
                else if (bfhi[1])
                {
                    a(i,j,k) = a(i, j-1-offset, k);
                }
            }
            // xhi & yhi
            else if (i == dhi.x+1 && j == dhi.y+1 && (bfhi[0] || bfhi[1]))
            {
                if (bfhi[0] && bfhi[1])
                {
                    a(i,j,k) = a(i-1-offset, j-1-offset, k);
                }
                else if (bfhi[0])
                {
                    a(i,j,k) = a(i-1-offset, j, k);
                }
                else if (bfhi[1])
                {
                    a(i,j,k) = a(i, j-1-offset, k);
                }
            }
            // xlo & zlo
            else if (i == dlo.x-1 && k == dlo.z-1 && (bflo[0] || bflo[2]))
            {
                if (bflo[0] && bflo[2])
                {
                    a(i,j,k) = a(i+1+offset, j, k+1+offset);
                }
                else if (bflo[0])
                {
                    a(i,j,k) = a(i+1+offset, j, k);
                }
                else if (bflo[2])
                {
                    a(i,j,k) = a(i, j, k+1+offset);
                }
            }
            // xhi & zlo
            else if (i == dhi.x+1 && k == dlo.z-1 && (bfhi[0] || bflo[2]))
            {
                if (bfhi[0] && bflo[2])
                {
                    a(i,j,k) = a(i-1-offset, j, k+1+offset);
                }
                else if (bfhi[0])
                {
                    a(i,j,k) = a(i-1-offset, j, k);
                }
                else if (bflo[2])
                {
                    a(i,j,k) = a(i, j, k+1+offset);
                }
            }
            // xlo & zhi
            else if (i == dlo.x-1 && k == dhi.z+1 && (bflo[0] || bfhi[2]))
            {
                if (bflo[0] && bfhi[2])
                {
                    a(i,j,k) = a(i+1+offset, j, k-1-offset);
                }
                else if (bflo[0])
                {
                    a(i,j,k) = a(i+1+offset, j, k);
                }
                else if (bfhi[2])
                {
                    a(i,j,k) = a(i, j, k-1-offset);
                }
            }
            // xhi & zhi
            else if (i == dhi.x+1 && k == dhi.z+1 && (bfhi[0] || bfhi[2]))
            {
                if (bfhi[0] && bfhi[2])
                {
                    a(i,j,k) = a(i-1-offset, j, k-1-offset);
                }
                else if (bfhi[0])
                {
                    a(i,j,k) = a(i-1-offset, j, k);
                }
                else if (bfhi[2])
                {
                    a(i,j,k) = a(i, j, k-1-offset);
                }
            }
            // ylo & zlo
            else if (j == dlo.y-1 && k == dlo.z-1 && (bflo[1] || bflo[2]))
            {
                if (bflo[1] && bflo[2])
                {
                    a(i,j,k) = a(i, j+1+offset, k+1+offset);
                }
                else if (bflo[1])
                {
                    a(i,j,k) = a(i, j+1+offset, k);
                }
                else if (bflo[2])
                {
                    a(i,j,k) = a(i, j, k+1+offset);
                }
            }
            // yhi & zlo
            else if (j == dhi.y+1 && k == dlo.z-1 && (bfhi[1] || bflo[2]))
            {
                if (bfhi[1] && bflo[2])
                {
                    a(i,j,k) = a(i, j-1-offset, k+1+offset);
                }
                else if (bfhi[1])
                {
                    a(i,j,k) = a(i, j-1-offset, k);
                }
                else if (bflo[2])
                {
                    a(i,j,k) = a(i, j, k+1+offset);
                }
            }
            // ylo & zhi
            else if (j == dlo.y-1 && k == dhi.z+1 && (bflo[1] || bfhi[2]))
            {
                if (bflo[1] && bfhi[2])
                {
                    a(i,j,k) = a(i, j+1+offset, k-1-offset);
                }
                else if (bflo[1])
                {
                    a(i,j,k) = a(i, j+1+offset, k);
                }
                else if (bfhi[2])
                {
                    a(i,j,k) = a(i, j, k-1-offset);
                }
            }
            // yhi & zhi
            else if (j == dhi.y+1 && k == dhi.z+1 && (bfhi[1] || bfhi[2]))
            {
                if (bfhi[1] && bfhi[2])
                {
                    a(i,j,k) = a(i, j-1-offset, k-1-offset);
                }
                else if (bfhi[1])
                {
                    a(i,j,k) = a(i, j-1-offset, k);
                }
                else if (bfhi[2])
                {
                    a(i,j,k) = a(i, j, k-1-offset);
                }
            }
            else if (i == dlo.x-1 && bflo[0])
            {
                a(i,j,k) = a(i+1+offset, j, k);
            }
            else if (i == dhi.x+1 && bfhi[0])
            {
                a(i,j,k) = a(i-1-offset, j, k);
            }
            else if (j == dlo.y-1 && bflo[1])
            {
                a(i,j,k) = a(i, j+1+offset, k);
            }
            else if (j == dhi.y+1 && bfhi[1])
            {
                a(i,j,k) = a(i, j-1-offset, k);
            }
            else if (k == dlo.z-1 && bflo[2])
            {
                a(i,j,k) = a(i, j, k+1+offset);
            }
            else if (k == dhi.z+1 && bfhi[2])
            {
                a(i,j,k) = a(i, j, k-1-offset);
            }
        }
    });
}